

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O2

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__AllocateNodePool
          (GmmPageTableMgr *this,uint32_t AddrAlignment,POOL_TYPE Type)

{
  GmmPageTablePool *this_00;
  HANDLE hAlloc;
  void *pGmmRes;
  GMM_STATUS GVar1;
  GmmPageTablePool *this_01;
  GMM_DEVICE_ALLOC local_68;
  GMM_GFX_ADDRESS local_38;
  
  local_68.CPUVA = 0;
  local_68.Priv = (GMM_RESOURCE_INFO *)0x0;
  local_68.Handle = (HANDLE)0x0;
  local_68.GfxVA = 0;
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  local_68.Size = 0x200000;
  local_68.hCsr = this->hCsr;
  local_68.Alignment = AddrAlignment;
  GVar1 = __GmmDeviceAlloc(this->pClientContext,&this->DeviceCbInt,&local_68);
  pGmmRes = local_68.Priv;
  hAlloc = local_68.Handle;
  if (GVar1 == GMM_SUCCESS) {
    this_01 = (GmmPageTablePool *)operator_new(0x58);
    if (this_01 != (GmmPageTablePool *)0x0) {
      local_38 = local_68.CPUVA;
      GmmPageTablePool::GmmPageTablePool
                (this_01,hAlloc,(GMM_RESOURCE_INFO *)pGmmRes,local_68.GfxVA,Type);
      this_01->CPUAddress = local_38;
      this_00 = this->pPool;
      if (this_00 == (GmmPageTablePool *)0x0) {
        this->NumNodePoolElements = 1;
      }
      else {
        this->NumNodePoolElements = this->NumNodePoolElements + 1;
        if (Type != POOL_TYPE_TRTTL2) {
          this_01 = GmmPageTablePool::InsertInList(this_00,this_01);
          goto LAB_001c2db3;
        }
        this_01->NextPool = this_00;
      }
      this->pPool = this_01;
      goto LAB_001c2db3;
    }
  }
  this_01 = (GMM_PAGETABLEPool *)0x0;
LAB_001c2db3:
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
  }
  return this_01;
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__AllocateNodePool(uint32_t AddrAlignment, GmmLib::POOL_TYPE Type)
{
    GMM_STATUS         Status      = GMM_SUCCESS;
    GMM_RESOURCE_INFO *pGmmResInfo = NULL;
    GMM_PAGETABLEPool *pTTPool     = NULL;
    HANDLE             PoolHnd     = 0;
    GMM_CLIENT         ClientType;
    GMM_DEVICE_ALLOC   Alloc = {0};

    ENTER_CRITICAL_SECTION

    //Allocate pool, sized PAGETABLE_POOL_MAX_NODES pages, assignable to TR/Aux L1/L2 tables
    //SVM allocation, always resident
    Alloc.Size      = PAGETABLE_POOL_SIZE;
    Alloc.Alignment = AddrAlignment;
    Alloc.hCsr      = hCsr;

    Status = __GmmDeviceAlloc(pClientContext, &DeviceCbInt, &Alloc);

    if(Status != GMM_SUCCESS)
    {
        __GMM_ASSERT(0);
        EXIT_CRITICAL_SECTION
        return NULL;
    }

    PoolHnd     = Alloc.Handle;
    pGmmResInfo = (GMM_RESOURCE_INFO *)Alloc.Priv;

    pTTPool = new GMM_PAGETABLEPool(PoolHnd, pGmmResInfo, Alloc.GfxVA, Alloc.CPUVA, Type);


    if(pTTPool)
    {
        if(pPool)
        {
            NumNodePoolElements++;
            if(Type == POOL_TYPE_TRTTL2) // TRTT-L2 not 1st node in Pool LinkedList, place it at beginning
            {
                pPool = pPool->InsertInListAtBegin(pTTPool);
            }
            else
            {
                pTTPool = pPool->InsertInList(pTTPool);
            }
        }
        else
        {
            NumNodePoolElements = 1;
            pPool               = pTTPool;
        }
    }
    else
    {
        __GMM_ASSERT(0);
        Status = GMM_OUT_OF_MEMORY;
    }

    EXIT_CRITICAL_SECTION
    return (Status == GMM_SUCCESS) ? pTTPool : NULL;
}